

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O3

void __thiscall YdiskRestClient::move(YdiskRestClient *this,string *from,string *to,BOOL overwrite)

{
  ulong *puVar1;
  Response *pRVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 extraout_RAX;
  Response *pRVar5;
  char *this_00;
  YdiskRestClient *this_01;
  pointer pcVar6;
  Client *this_02;
  string empty_body;
  shared_ptr<httplib::Response> r;
  string url;
  ulong *local_c8;
  undefined8 local_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [64];
  Headers *local_68 [2];
  Headers local_58;
  
  this_00 = "/v1/disk/resources/move?from=";
  local_68[0] = &local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"/v1/disk/resources/move?from=","");
  url_encode((string *)((long)&local_58._M_t._M_impl.super__Rb_tree_header._M_header + 8),
             (YdiskRestClient *)this_00,from);
  this_01 = (YdiskRestClient *)0x15c161;
  plVar3 = (long *)std::__cxx11::string::append
                             ((char *)((long)&local_58._M_t._M_impl.super__Rb_tree_header._M_header
                                      + 8));
  pRVar2 = (Response *)(local_a8 + 0x10);
  pRVar5 = (Response *)(plVar3 + 2);
  if ((Response *)*plVar3 == pRVar5) {
    local_a8._16_8_ = (pRVar5->version)._M_dataplus._M_p;
    local_a8._24_8_ = plVar3[3];
    local_a8._0_8_ = pRVar2;
  }
  else {
    local_a8._16_8_ = (pRVar5->version)._M_dataplus._M_p;
    local_a8._0_8_ = (Response *)*plVar3;
  }
  local_a8._8_8_ = plVar3[1];
  *plVar3 = (long)pRVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  url_encode((string *)(local_a8 + 0x20),this_01,to);
  pcVar6 = (pointer)0xf;
  if ((Response *)local_a8._0_8_ != pRVar2) {
    pcVar6 = (pointer)local_a8._16_8_;
  }
  if (pcVar6 < (pointer)(local_a8._8_8_ + local_a8._40_8_)) {
    pcVar6 = (pointer)0xf;
    if ((undefined1 *)local_a8._32_8_ != local_a8 + 0x30) {
      pcVar6 = (pointer)local_a8._48_8_;
    }
    if (pcVar6 < (pointer)(local_a8._8_8_ + local_a8._40_8_)) goto LAB_001404fe;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)(local_a8 + 0x20),0,(char *)0x0,local_a8._0_8_);
  }
  else {
LAB_001404fe:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_a8,local_a8._32_8_);
  }
  local_c8 = &local_b8;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = puVar4[3];
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (ulong *)*puVar4;
  }
  local_c0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::_M_append((char *)local_68,(ulong)local_c8);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((undefined1 *)local_a8._32_8_ != local_a8 + 0x30) {
    operator_delete((void *)local_a8._32_8_,(ulong)(local_a8._48_8_ + 1));
  }
  if ((Response *)local_a8._0_8_ != pRVar2) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
  }
  if (local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)((long)&local_58._M_t._M_impl.super__Rb_tree_header._M_header + 0x18U)) {
    operator_delete(local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                    (ulong)((long)&(local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right)
                                   ->_M_color + 1));
  }
  std::__cxx11::string::append((char *)local_68);
  std::__cxx11::string::append((char *)local_68);
  local_c0 = 0;
  local_b8 = local_b8 & 0xffffffffffffff00;
  this_02 = (Client *)local_a8;
  local_c8 = &local_b8;
  httplib::Client::Post
            (this_02,(char *)this->http_client,local_68[0],(string *)&this->headers,
             (char *)&local_c8);
  if ((Response *)local_a8._0_8_ != (Response *)0x0) {
    if (*(int *)(local_a8._0_8_ + 0x20) != 0xc9) {
      if (*(int *)(local_a8._0_8_ + 0x20) != 0xca) goto LAB_001406b3;
      wait_success_operation(this,(string *)(local_a8._0_8_ + 0x58));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_68[0] != &local_58) {
      operator_delete(local_68[0],local_58._M_t._M_impl._0_8_ + 1);
    }
    return;
  }
LAB_001406b3:
  throw_response_error((YdiskRestClient *)this_02,(Response *)local_a8._0_8_);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_68[0] != &local_58) {
    operator_delete(local_68[0],local_58._M_t._M_impl._0_8_ + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::move(std::string from, std::string to, BOOL overwrite)
{
    std::string url("/v1/disk/resources/move?from=");
    url += url_encode(from) + "&path=" + url_encode(to);
    url += "&overwrite=";
    url += (overwrite == true ? "true": "false");
    std::string empty_body;
    auto r = http_client->Post(url.c_str(), headers, empty_body, "text/plain");

    if(r.get() && r->status==201){
        //success
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is moving, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}